

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

void fmt::v8::detail::
     value<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>>
     ::
     format_custom_arg<jessilib::io::ansi::text_wrapper,fmt::v8::formatter<jessilib::io::ansi::text_wrapper,char8_t,void>>
               (void *arg,parse_context_type *parse_ctx,
               basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>
               *ctx)

{
  iterator it;
  formatter<jessilib::io::ansi::text_wrapper,_char8_t,_void> f;
  dynamic_format_specs<char8_t> local_68;
  
  local_68.precision_ref.val.name.data_ = (char8_t *)0x0;
  local_68.precision_ref.val.name.size_ = 0;
  local_68.width_ref.val.name.size_ = 0;
  local_68.precision_ref.kind = none;
  local_68.precision_ref._4_4_ = 0;
  local_68.width_ref.kind = none;
  local_68.width_ref._4_4_ = 0;
  local_68.width_ref.val.name.data_ = (char8_t *)0x0;
  local_68.super_basic_format_specs<char8_t>.width = 0;
  local_68.super_basic_format_specs<char8_t>.precision = 0;
  local_68.super_basic_format_specs<char8_t>.type = none;
  local_68.super_basic_format_specs<char8_t>._9_2_ = 0;
  local_68.super_basic_format_specs<char8_t>.fill.data_[0] = '\0';
  local_68.super_basic_format_specs<char8_t>.fill.data_[1] = '\0';
  local_68.super_basic_format_specs<char8_t>.fill.data_[2] = '\0';
  local_68.super_basic_format_specs<char8_t>.fill.data_[3] = '\0';
  local_68.super_basic_format_specs<char8_t>.fill.size_ = '\0';
  dynamic_format_specs<char8_t>::dynamic_format_specs(&local_68);
  it = formatter<fmt::v8::basic_string_view<char8_t>,char8_t,void>::
       parse<fmt::v8::basic_format_parse_context<char8_t,fmt::v8::detail::error_handler>>
                 ((formatter<fmt::v8::basic_string_view<char8_t>,char8_t,void> *)&local_68,parse_ctx
                 );
  basic_format_parse_context<char8_t,_fmt::v8::detail::error_handler>::advance_to(parse_ctx,it);
  formatter<jessilib::io::ansi::text_wrapper,char8_t,void>::
  format<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>>
            ((formatter<jessilib::io::ansi::text_wrapper,char8_t,void> *)&local_68,
             (text_wrapper *)arg,ctx);
  return;
}

Assistant:

static void format_custom_arg(void* arg,
                                typename Context::parse_context_type& parse_ctx,
                                Context& ctx) {
    auto f = Formatter();
    parse_ctx.advance_to(f.parse(parse_ctx));
    using qualified_type =
        conditional_t<has_const_formatter<T, Context>(), const T, T>;
    ctx.advance_to(f.format(*static_cast<qualified_type*>(arg), ctx));
  }